

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<int,fmt::v6::basic_format_specs<char>>::num_writer>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,int num_digits,string_view prefix,
          format_specs specs,num_writer f)

{
  int in_ESI;
  undefined8 in_R8;
  ulong in_R9;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<int,_fmt::v6::basic_format_specs<char>_>::num_writer>
  *in_stack_00000010;
  undefined1 in_stack_00000018;
  type unsiged_width;
  size_t padding;
  char_type fill;
  size_t size;
  undefined7 in_stack_ffffffffffffffa9;
  undefined4 in_stack_ffffffffffffffb0;
  type in_stack_ffffffffffffffb4;
  int local_20;
  int iStack_1c;
  undefined8 local_18;
  basic_string_view<char> local_10;
  
  local_18 = in_R9;
  basic_string_view<char>::size(&local_10);
  to_unsigned<int>(in_ESI);
  fill_t<char>::operator[]((fill_t<char> *)((long)&local_18 + 2),0);
  if ((local_18._1_1_ & 0xf) == 4) {
    local_20 = (int)in_R8;
    in_stack_ffffffffffffffb4 = to_unsigned<int>(local_20);
  }
  else {
    iStack_1c = (int)((ulong)in_R8 >> 0x20);
    if (in_ESI < iStack_1c) {
      basic_string_view<char>::size(&local_10);
      to_unsigned<int>(iStack_1c);
      to_unsigned<int>(iStack_1c - in_ESI);
    }
  }
  if ((local_18 & 0xf00) == 0) {
    local_18 = local_18 & 0xfffffffffffff0ff | 0x200;
  }
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<int,fmt::v6::basic_format_specs<char>>::num_writer>>
            ((basic_writer<fmt::v6::buffer_range<char>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (format_specs *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_00000018),in_stack_00000010
            );
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }